

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void CountUniqueBoardPositions<ttt::Board>(int depth)

{
  Board *this;
  pointer plVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  __node_base_ptr *pp_Var8;
  _Hash_node_base *p_Var9;
  pointer plVar10;
  __node_gen_type __node_gen;
  Board ng;
  long m;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  unique_hashes;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  sets [2];
  int local_138;
  vector<long,_std::allocator<long>_> local_130;
  Board local_118;
  ulong local_108;
  long local_100;
  long local_f8;
  size_t local_f0;
  long local_e8;
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_e0;
  _Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Game size: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes\n",7);
  lVar5 = 0x70;
  pp_Var8 = &local_a8[0]._M_single_bucket;
  do {
    ((_Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      *)(pp_Var8 + -6))->_M_buckets = pp_Var8;
    pp_Var8[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var8 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var8[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var8 + -2))->_M_max_load_factor = 1.0;
    pp_Var8[-1] = (__node_base_ptr)0x0;
    *pp_Var8 = (__node_base_ptr)0x0;
    pp_Var8 = pp_Var8 + 7;
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != 0);
  ttt::Board::Board((Board *)&local_e0);
  local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_a8;
  std::
  _Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<ttt::Board_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<ttt::Board,true>>>>
            ((_Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_e0);
  if (0 < depth) {
    uVar3 = 0;
    lVar5 = 1;
    local_138 = 0;
    do {
      local_e0._M_buckets = &local_e0._M_single_bucket;
      local_e0._M_bucket_count = 1;
      local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_e0._M_element_count = 0;
      local_e0._M_rehash_policy._M_max_load_factor = 1.0;
      local_e0._M_rehash_policy._M_next_resize = 0;
      local_e0._M_single_bucket = (__node_base_ptr)0x0;
      local_f8 = lVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Working on depth: ",0x12);
      local_138 = local_138 + 1;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_138);
      local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_130,1);
      uVar6 = (ulong)(1 - uVar3);
      local_108 = uVar6;
      std::
      _Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(local_a8 + uVar6);
      local_100 = std::chrono::_V2::system_clock::now();
      for (p_Var9 = local_a8[uVar3]._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
          p_Var9 = p_Var9->_M_nxt) {
        this = (Board *)(p_Var9 + 1);
        iVar2 = ttt::Board::GetStatus(this);
        if (iVar2 == -1) {
          ttt::Board::GetPossibleMoves(&local_130,this);
          plVar1 = local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (plVar10 = local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start; plVar10 != plVar1; plVar10 = plVar10 + 1)
          {
            local_e8 = *plVar10;
            local_118._8_2_ = *(undefined2 *)&p_Var9[2]._M_nxt;
            local_118.board._M_elems._0_8_ = *(undefined8 *)(this->board)._M_elems;
            ttt::Board::ApplyMove(&local_118,&local_e8);
            std::
            _Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<ttt::Board&>
                      ((_Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)(local_a8 + uVar6),&local_118);
            local_f0 = ttt::Board::Hash(&local_118);
            std::
            _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&local_e0,&local_f0);
          }
          if (local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
      }
      lVar7 = std::chrono::_V2::system_clock::now();
      lVar7 = lVar7 - local_100;
      lVar5 = local_f8 + local_a8[uVar6]._M_element_count;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth hash count: ",0x1a);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::ostream::_M_insert<double>
                         (((((double)CONCAT44(0x45300000,(int)(local_e0._M_element_count >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_e0._M_element_count) -
                           4503599627370496.0)) * 100.0) /
                          (((double)CONCAT44(0x45300000,
                                             (int)(local_a8[uVar6]._M_element_count >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_a8[uVar6]._M_element_count) -
                          4503599627370496.0)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth node count: ",0x1a);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", size: ",8);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"MB\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth duration  : ",0x1a);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds ",9);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," milliseconds, ",0xf);
      poVar4 = std::ostream::_M_insert<double>
                         (((((double)CONCAT44(0x45300000,
                                              (int)(local_a8[uVar6]._M_element_count >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_a8[uVar6]._M_element_count) -
                           4503599627370496.0)) / (double)(lVar7 / 1000000)) * 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," nps\n",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Total count             : ",0x1a);
      poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_130.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_130,1);
      std::
      _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_e0);
      uVar3 = (uint)local_108;
    } while (local_138 != depth);
  }
  lVar5 = 0x38;
  do {
    std::
    _Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)&local_a8[0]._M_buckets + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  return;
}

Assistant:

void
CountUniqueBoardPositions(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::unordered_set<IGame> sets[2];
    sets[0].insert({{}});
    int set_ind = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::unordered_set<long long> unique_hashes;
        std::cout << "Working on depth: " << i + 1 << '\n';
        sets[1 - set_ind].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : sets[set_ind])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                sets[1 - set_ind].emplace(ng);
                unique_hashes.emplace(ng.Hash());
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += sets[1 - set_ind].size();
        std::cout << "Current depth hash count: " << unique_hashes.size() << " / " << sets[1 - set_ind].size() << " = " << double(unique_hashes.size()) * 100.0 / sets[1 - set_ind].size() << "%\n";
        std::cout << "Current depth node count: " << sets[1 - set_ind].size() << ", size: " << sets[1 - set_ind].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Current depth duration  : " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(sets[1 - set_ind].size()) / millis * 1000 << " nps\n";
        std::cout << "Total count             : " << total << '\n';
        set_ind = 1 - set_ind;
    }
}